

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O2

wchar_t lzx_read_bitlen(lzx_stream *strm,huffman *d,wchar_t end)

{
  lzx_br *br;
  byte bVar1;
  lzx_dec *plVar2;
  ulong uVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uchar *puVar9;
  long lVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  bool bVar13;
  
  plVar2 = strm->ds;
  wVar11 = plVar2->loop;
  if (wVar11 == L'\0') {
    d->freq[0xc] = L'\0';
    d->freq[0xd] = L'\0';
    d->freq[0xe] = L'\0';
    d->freq[0xf] = L'\0';
    d->freq[8] = L'\0';
    d->freq[9] = L'\0';
    d->freq[10] = L'\0';
    d->freq[0xb] = L'\0';
    d->freq[4] = L'\0';
    d->freq[5] = L'\0';
    d->freq[6] = L'\0';
    d->freq[7] = L'\0';
    d->freq[0] = L'\0';
    d->freq[1] = L'\0';
    d->freq[2] = L'\0';
    d->freq[3] = L'\0';
    d->freq[0x10] = L'\0';
  }
  if (end < L'\0') {
    end = d->len_size;
  }
  br = &plVar2->br;
  do {
    if (end <= wVar11) {
      wVar5 = L'\x01';
LAB_0012009e:
      plVar2->loop = wVar11;
      return wVar5;
    }
    plVar2->loop = wVar11;
    wVar5 = (plVar2->br).cache_avail;
    wVar12 = (plVar2->pt).max_bits;
    if (wVar5 < wVar12) {
      wVar4 = lzx_br_fillup(strm,br);
      wVar5 = (plVar2->br).cache_avail;
      wVar12 = (plVar2->pt).max_bits;
      if (wVar4 != L'\0' || wVar12 <= wVar5) goto LAB_0011fdb1;
LAB_0012009c:
      wVar5 = L'\0';
      goto LAB_0012009e;
    }
LAB_0011fdb1:
    wVar4 = lzx_decode_huffman(&plVar2->pt,
                               (uint)((plVar2->br).cache_buffer >>
                                     ((char)wVar5 - (char)wVar12 & 0x3fU)) & cache_masks[wVar12]);
    puVar9 = (plVar2->pt).bitlen;
    if ((short)wVar4 == 0x13) {
      uVar6 = (uint)puVar9[0x13];
      if (wVar5 < (uint)puVar9[0x13] + wVar12 + L'\x01') {
        wVar5 = lzx_br_fillup(strm,br);
        puVar9 = (plVar2->pt).bitlen;
        if (wVar5 == L'\0') {
          wVar5 = (plVar2->br).cache_avail;
          uVar6 = (uint)puVar9[0x13];
          if (wVar5 < (plVar2->pt).max_bits + (uint)puVar9[0x13] + L'\x01') goto LAB_0012009c;
        }
        else {
          uVar6 = (uint)puVar9[0x13];
          wVar5 = (plVar2->br).cache_avail;
        }
      }
      (plVar2->br).cache_avail = wVar5 - uVar6;
      uVar3 = (plVar2->br).cache_buffer;
      wVar5 = (wVar5 - uVar6) + L'\xffffffff';
      bVar13 = (uVar3 >> ((ulong)(uint)wVar5 & 0x3f) & 1) != 0;
      if (end < wVar11 + (uint)bVar13 + L'\x04') {
        return L'\xffffffff';
      }
      (plVar2->br).cache_avail = wVar5;
      wVar12 = (plVar2->pt).max_bits;
      wVar12 = lzx_decode_huffman(&plVar2->pt,
                                  (uint)(uVar3 >> ((char)wVar5 - (char)wVar12 & 0x3fU)) &
                                  cache_masks[wVar12]);
      (plVar2->br).cache_avail = wVar5 - (uint)puVar9[(uint)wVar12];
      lVar10 = (long)wVar11;
      uVar3 = (long)(((uint)d->bitlen[lVar10] - wVar12) + 0x11) % 0x11;
      uVar8 = uVar3 & 0xffffffff;
      if ((int)uVar3 < 0) {
        return L'\xffffffff';
      }
      uVar6 = (uint)bVar13;
      for (iVar7 = 0; -4 - uVar6 != iVar7; iVar7 = iVar7 + -1) {
        d->bitlen[lVar10] = (uchar)uVar8;
        lVar10 = lVar10 + 1;
      }
      wVar11 = wVar11 - iVar7;
      d->freq[uVar8] = d->freq[uVar8] + (uVar6 | 4);
    }
    else if ((wVar4 & 0xffffU) == 0x12) {
      uVar6 = (uint)puVar9[0x12];
      if (wVar5 < (uint)puVar9[0x12] + L'\x05') {
        wVar5 = lzx_br_fillup(strm,br);
        puVar9 = (plVar2->pt).bitlen;
        if (wVar5 == L'\0') {
          wVar5 = (plVar2->br).cache_avail;
          bVar1 = puVar9[0x12];
          uVar6 = (uint)bVar1;
          if (wVar5 < (uint)bVar1 + L'\x05') goto LAB_0012009c;
        }
        else {
          uVar6 = (uint)puVar9[0x12];
          wVar5 = (plVar2->br).cache_avail;
        }
      }
      (plVar2->br).cache_avail = wVar5 - uVar6;
      wVar12 = (wVar5 - uVar6) + L'\xfffffffb';
      uVar6 = (uint)((plVar2->br).cache_buffer >> ((byte)wVar12 & 0x3f)) & 0x1f;
      wVar5 = uVar6 + wVar11 + L'\x14';
      if (end < wVar5) {
        return L'\xffffffff';
      }
      (plVar2->br).cache_avail = wVar12;
      memset(d->bitlen + wVar11,0,(ulong)(uVar6 + 0x14));
      wVar11 = wVar5;
    }
    else {
      lVar10 = (long)wVar11;
      if ((wVar4 & 0xffffU) == 0x11) {
        uVar6 = (uint)puVar9[0x11];
        if (wVar5 < (uint)puVar9[0x11] + L'\x04') {
          wVar5 = lzx_br_fillup(strm,br);
          puVar9 = (plVar2->pt).bitlen;
          if (wVar5 == L'\0') {
            wVar5 = (plVar2->br).cache_avail;
            bVar1 = puVar9[0x11];
            uVar6 = (uint)bVar1;
            if (wVar5 < (uint)bVar1 + L'\x04') goto LAB_0012009c;
          }
          else {
            uVar6 = (uint)puVar9[0x11];
            wVar5 = (plVar2->br).cache_avail;
          }
        }
        (plVar2->br).cache_avail = wVar5 - uVar6;
        wVar5 = (wVar5 - uVar6) + L'\xfffffffc';
        uVar6 = (uint)((plVar2->br).cache_buffer >> ((byte)wVar5 & 0x3f)) & 0xf;
        if (end < uVar6 + wVar11 + L'\x04') {
          return L'\xffffffff';
        }
        (plVar2->br).cache_avail = wVar5;
        for (iVar7 = 0; -4 - uVar6 != iVar7; iVar7 = iVar7 + -1) {
          d->bitlen[lVar10] = '\0';
          lVar10 = lVar10 + 1;
        }
        wVar11 = wVar11 - iVar7;
      }
      else {
        (plVar2->br).cache_avail = wVar5 - (uint)puVar9[(uint)wVar4];
        puVar9 = d->bitlen;
        uVar3 = (long)(((uint)puVar9[lVar10] - wVar4) + 0x11) % 0x11;
        uVar8 = uVar3 & 0xffffffff;
        if ((int)uVar3 < 0) {
          return L'\xffffffff';
        }
        d->freq[uVar8] = d->freq[uVar8] + L'\x01';
        puVar9[lVar10] = (uchar)uVar8;
        wVar11 = wVar11 + L'\x01';
      }
    }
  } while( true );
}

Assistant:

static int
lzx_read_bitlen(struct lzx_stream *strm, struct huffman *d, int end)
{
	struct lzx_dec *ds = strm->ds;
	struct lzx_br *br = &(ds->br);
	int c, i, j, ret, same;
	unsigned rbits;

	i = ds->loop;
	if (i == 0)
		memset(d->freq, 0, sizeof(d->freq));
	ret = 0;
	if (end < 0)
		end = d->len_size;
	while (i < end) {
		ds->loop = i;
		if (!lzx_br_read_ahead(strm, br, ds->pt.max_bits))
			goto getdata;
		rbits = lzx_br_bits(br, ds->pt.max_bits);
		c = lzx_decode_huffman(&(ds->pt), rbits);
		switch (c) {
		case 17:/* several zero lengths, from 4 to 19. */
			if (!lzx_br_read_ahead(strm, br, ds->pt.bitlen[c]+4))
				goto getdata;
			lzx_br_consume(br, ds->pt.bitlen[c]);
			same = lzx_br_bits(br, 4) + 4;
			if (i + same > end)
				return (-1);/* Invalid */
			lzx_br_consume(br, 4);
			for (j = 0; j < same; j++)
				d->bitlen[i++] = 0;
			break;
		case 18:/* many zero lengths, from 20 to 51. */
			if (!lzx_br_read_ahead(strm, br, ds->pt.bitlen[c]+5))
				goto getdata;
			lzx_br_consume(br, ds->pt.bitlen[c]);
			same = lzx_br_bits(br, 5) + 20;
			if (i + same > end)
				return (-1);/* Invalid */
			lzx_br_consume(br, 5);
			memset(d->bitlen + i, 0, same);
			i += same;
			break;
		case 19:/* a few same lengths. */
			if (!lzx_br_read_ahead(strm, br,
			    ds->pt.bitlen[c]+1+ds->pt.max_bits))
				goto getdata;
			lzx_br_consume(br, ds->pt.bitlen[c]);
			same = lzx_br_bits(br, 1) + 4;
			if (i + same > end)
				return (-1);
			lzx_br_consume(br, 1);
			rbits = lzx_br_bits(br, ds->pt.max_bits);
			c = lzx_decode_huffman(&(ds->pt), rbits);
			lzx_br_consume(br, ds->pt.bitlen[c]);
			c = (d->bitlen[i] - c + 17) % 17;
			if (c < 0)
				return (-1);/* Invalid */
			for (j = 0; j < same; j++)
				d->bitlen[i++] = c;
			d->freq[c] += same;
			break;
		default:
			lzx_br_consume(br, ds->pt.bitlen[c]);
			c = (d->bitlen[i] - c + 17) % 17;
			if (c < 0)
				return (-1);/* Invalid */
			d->freq[c]++;
			d->bitlen[i++] = c;
			break;
		}
	}
	ret = 1;
getdata:
	ds->loop = i;
	return (ret);
}